

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O1

void add_linear_comb_weighted<float,std::vector<double,std::allocator<double>>,long_double>
               (size_t *ix_arr,size_t st,size_t end,double *res,float *x,double *coef,double x_sd,
               double x_mean,double *fill_val,MissingAction missing_action,double *buffer_arr,
               size_t *buffer_NAs,bool first_run,vector<double,_std::allocator<double>_> *w)

{
  double dVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  size_t *psVar4;
  pointer __first;
  pointer __last;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  double *pdVar8;
  long lVar9;
  size_type __n;
  size_t sVar10;
  size_t row;
  longdouble lVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> sorted_ix;
  vector<double,_std::allocator<double>_> obs_weight;
  allocator_type local_d1;
  longdouble local_d0;
  double *local_c0;
  double local_b8;
  long local_b0;
  size_t *local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a0;
  vector<double,_std::allocator<double>_> local_88;
  double *local_68;
  pointer local_60;
  pointer local_58;
  float *local_50;
  double local_48;
  double local_40;
  double local_38;
  
  bVar3 = first_run;
  if (first_run) {
    *coef = *coef / x_sd;
  }
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_c0 = coef;
  local_b8 = x_mean;
  local_a8 = ix_arr;
  if (first_run && missing_action != Fail) {
    local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (unsigned_long *)0x0;
    std::vector<double,_std::allocator<double>_>::resize
              (&local_88,(end - st) + 1,(value_type_conflict *)&local_a0);
  }
  psVar4 = local_a8;
  if (missing_action == Fail) {
    if (st <= end) {
      local_d0 = (longdouble)CONCAT28(local_d0._8_2_,*local_c0);
      do {
        dVar12 = fma((double)x[psVar4[st]] - local_b8,local_d0._0_8_,*res);
        *res = dVar12;
        st = st + 1;
        res = res + 1;
      } while (st <= end);
    }
  }
  else if (bVar3) {
    local_d0 = (longdouble)0;
    if (end < st) {
      __n = 0;
      lVar9 = 0;
    }
    else {
      local_58 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      local_60 = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_d0 = (longdouble)0;
      local_68 = buffer_arr;
      __n = 0;
      local_b0 = 0;
      pdVar8 = res;
      sVar10 = st;
      local_50 = x;
      do {
        if ((uint)ABS(local_50[local_a8[sVar10]]) < 0x7f800000) {
          local_40 = local_58[local_a8[sVar10]];
          local_48 = (double)local_50[local_a8[sVar10]];
          dVar12 = fma(local_48 - local_b8,*local_c0,*pdVar8);
          *pdVar8 = dVar12;
          local_60[__n] = local_40;
          local_68[__n] = local_48;
          __n = __n + 1;
          local_38 = local_40;
          local_d0 = local_d0 + (longdouble)local_40;
        }
        else {
          buffer_NAs[local_b0] = sVar10;
          local_b0 = local_b0 + 1;
        }
        sVar10 = sVar10 + 1;
        pdVar8 = pdVar8 + 1;
      } while (sVar10 <= end);
      local_d0 = local_d0 * (longdouble)0.5;
      lVar9 = local_b0;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_a0,__n,&local_d1);
    __last = local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    __first = local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    auVar2 = _DAT_0036b1f0;
    if (local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar5 = ((long)local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start) - 8;
      auVar16._8_4_ = (int)uVar5;
      auVar16._0_8_ = uVar5;
      auVar16._12_4_ = (int)(uVar5 >> 0x20);
      auVar13._0_8_ = uVar5 >> 3;
      auVar13._8_8_ = auVar16._8_8_ >> 3;
      uVar7 = 0;
      auVar13 = auVar13 ^ _DAT_0036b1f0;
      auVar14 = _DAT_0036b1e0;
      do {
        auVar16 = auVar14 ^ auVar2;
        if ((bool)(~(auVar16._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar16._0_4_ ||
                    auVar13._4_4_ < auVar16._4_4_) & 1)) {
          local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar7] = uVar7;
        }
        if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
            auVar16._12_4_ <= auVar13._12_4_) {
          local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar7 + 1] = uVar7 + 1;
        }
        uVar7 = uVar7 + 2;
        lVar6 = auVar14._8_8_;
        auVar14._0_8_ = auVar14._0_8_ + 2;
        auVar14._8_8_ = lVar6 + 2;
      } while (((uVar5 >> 3) + 2 & 0xfffffffffffffffe) != uVar7);
      if (local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar5 = (long)local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3;
        lVar6 = 0x3f;
        if (uVar5 != 0) {
          for (; uVar5 >> lVar6 == 0; lVar6 = lVar6 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<add_linear_comb_weighted<float,std::vector<double,std::allocator<double>>,long_double>(unsigned_long_const*,unsigned_long,unsigned_long,double*,float_const*,double&,double,double,double&,MissingAction,double*,unsigned_long*,bool,std::vector<double,std::allocator<double>>&)::_lambda(unsigned_long,unsigned_long)_1_>>
                  ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                   (ulong)(((uint)lVar6 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_david_cortes[P]isotree_src_mult_hpp:627:19)>
                    )&buffer_arr);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<add_linear_comb_weighted<float,std::vector<double,std::allocator<double>>,long_double>(unsigned_long_const*,unsigned_long,unsigned_long,double*,float_const*,double&,double,double,double&,MissingAction,double*,unsigned_long*,bool,std::vector<double,std::allocator<double>>&)::_lambda(unsigned_long,unsigned_long)_1_>>
                  ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )__first,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )__last,(_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_david_cortes[P]isotree_src_mult_hpp:627:19)>
                             )&buffer_arr);
      }
    }
    *fill_val = buffer_arr
                [local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1]];
    if (__n != 0) {
      lVar11 = (longdouble)0;
      uVar5 = 0;
      do {
        lVar11 = lVar11 + (longdouble)
                          local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start
                          [local_a0.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar5]];
        if (local_d0 <= lVar11) {
          dVar12 = buffer_arr
                   [local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar5]];
          if (((lVar11 == local_d0) && (!NAN(lVar11) && !NAN(local_d0))) && (uVar5 < __n - 1)) {
            dVar12 = dVar12 + (buffer_arr
                               [local_a0.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar5 + 1]] - dVar12) * 0.5
            ;
          }
          *fill_val = dVar12;
          break;
        }
        uVar5 = uVar5 + 1;
      } while (__n != uVar5);
    }
    dVar12 = (*fill_val - local_b8) * *local_c0;
    *fill_val = dVar12;
    if ((lVar9 != 0) && ((dVar12 != 0.0 || (NAN(dVar12))))) {
      lVar6 = 0;
      do {
        res[buffer_NAs[lVar6] - st] = res[buffer_NAs[lVar6] - st] + dVar12;
        lVar6 = lVar6 + 1;
      } while (lVar9 != lVar6);
    }
    if (local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
      operator_delete(local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else if (st <= end) {
    dVar12 = *local_c0;
    dVar1 = *fill_val;
    do {
      dVar15 = dVar1;
      if ((uint)ABS(x[local_a8[st]]) < 0x7f800000) {
        dVar15 = ((double)x[local_a8[st]] - local_b8) * dVar12;
      }
      *res = dVar15 + *res;
      st = st + 1;
      res = res + 1;
    } while (st <= end);
  }
  if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void add_linear_comb_weighted(const size_t ix_arr[], size_t st, size_t end, double *restrict res,
                              const real_t_ *restrict x, double &coef, double x_sd, double x_mean, double &restrict fill_val,
                              MissingAction missing_action, double *restrict buffer_arr,
                              size_t *restrict buffer_NAs, bool first_run, mapping &restrict w)
{
    /* TODO: here don't need the buffer for NAs */

    if (first_run)
        coef /= x_sd;

    size_t cnt = 0;
    size_t cnt_NA = 0;
    double *restrict res_write = res - st;
    ldouble_safe cumw = 0;
    double w_this;
    /* TODO: these buffers should be allocated externally */
    std::vector<double> obs_weight;

    if (first_run && missing_action != Fail)
    {
        obs_weight.resize(end - st + 1, 0.);
    }

    if (missing_action == Fail)
    {    
        for (size_t row = st; row <= end; row++)
            res_write[row] = std::fma(x[ix_arr[row]] - x_mean, coef, res_write[row]);
    }

    else
    {
        if (first_run)
        {
            for (size_t row = st; row <= end; row++)
            {
                if (likely(!is_na_or_inf(x[ix_arr[row]])))
                {
                    w_this = w[ix_arr[row]];
                    res_write[row]     = std::fma(x[ix_arr[row]] - x_mean, coef, res_write[row]);
                    obs_weight[cnt]    = w_this;
                    buffer_arr[cnt++]  = x[ix_arr[row]];
                    cumw += w_this;
                }

                else
                {
                    buffer_NAs[cnt_NA++] = row;
                }

            }
        }

        else
        {
            for (size_t row = st; row <= end; row++)
            {
                res_write[row] += (is_na_or_inf(x[ix_arr[row]]))? fill_val : ( (x[ix_arr[row]]-x_mean) * coef );
            }
            return;
        }


        ldouble_safe mid_point = cumw / (ldouble_safe)2;
        std::vector<size_t> sorted_ix(cnt);
        std::iota(sorted_ix.begin(), sorted_ix.end(), (size_t)0);
        std::sort(sorted_ix.begin(), sorted_ix.end(),
                  [&buffer_arr](const size_t a, const size_t b){return buffer_arr[a] < buffer_arr[b];});
        ldouble_safe currw = 0;
        fill_val = buffer_arr[sorted_ix.back()]; /* <- will overwrite later */
        /* TODO: is this median calculation correct? should it do a weighted interpolation? */
        for (size_t ix = 0; ix < cnt; ix++)
        {
            currw += obs_weight[sorted_ix[ix]];
            if (currw >= mid_point)
            {
                if (currw == mid_point && ix < cnt-1)
                    fill_val = buffer_arr[sorted_ix[ix]] + (buffer_arr[sorted_ix[ix+1]] - buffer_arr[sorted_ix[ix]]) / 2.0;
                else
                    fill_val = buffer_arr[sorted_ix[ix]];
                break;
            }
        }

        fill_val = (fill_val - x_mean) * coef;
        if (cnt_NA && fill_val)
        {
            for (size_t row = 0; row < cnt_NA; row++)
                res_write[buffer_NAs[row]] += fill_val;
        }

    }
}